

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaTests.cc
# Opt level: O3

void avro::schema::testBasic_fail(char *schema)

{
  undefined1 *puVar1;
  size_t sVar2;
  assertion_result local_210;
  char local_1f0 [8];
  shared_count local_1e8 [3];
  const_string local_1d0;
  undefined1 local_1c0 [16];
  undefined8 *local_1b0;
  char *local_1a8;
  ios_base local_150 [264];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  if (schema == (char *)0x0) {
    std::ios::clear((int)(&stack0xfffffffffffffde8 + (long)*(_func_int **)(local_1c0._0_8_ + -0x18))
                    + 0x58);
  }
  else {
    sVar2 = strlen(schema);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,schema,sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_48,(string *)&local_210);
  if ((shared_count *)
      CONCAT71(local_210._1_7_,
               local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
               value) != &local_210.m_message.pn) {
    operator_delete((undefined1 *)
                    CONCAT71(local_210._1_7_,
                             local_210.p_predicate_value.super_readonly_property<bool>.
                             super_class_property<bool>.value),
                    (ulong)((long)&(local_210.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  puVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b09c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x93;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base(local_150);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b09c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x192237);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x94;
  avro::compileJsonSchemaFromString(local_1f0);
  boost::detail::shared_count::~shared_count(local_1e8);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b09c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x192237);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x94;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0[8] = false;
  local_1c0._0_8_ = &PTR__lazy_ostream_001ad2a8;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = "exception Exception expected but not raised";
  local_1d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  local_1d0.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)local_1c0,&local_1d0,0x94,CHECK,CHECK_MSG,0);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  return;
}

Assistant:

static void testBasic_fail(const char* schema)
{
    BOOST_TEST_CHECKPOINT(schema);
    BOOST_CHECK_THROW(compileJsonSchemaFromString(schema), Exception);
}